

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O0

dynlink dynlink_load_absolute(dynlink_path path,dynlink_flags flags)

{
  size_t sVar1;
  dynlink_impl pvVar2;
  dynlink_flags in_ESI;
  char *in_RDI;
  dynlink handle;
  dynlink handle_00;
  dynlink local_8;
  
  local_8 = (dynlink)malloc(0x2010);
  if (local_8 == (dynlink)0x0) {
    local_8 = (dynlink)0x0;
  }
  else {
    handle_00 = (dynlink)local_8->name_impl;
    sVar1 = strnlen(in_RDI,0x1000);
    strncpy(handle_00->name,in_RDI,sVar1 + 1);
    local_8->flags = in_ESI;
    pvVar2 = dynlink_impl_load(handle_00);
    local_8->impl = pvVar2;
    if (local_8->impl == (dynlink_impl)0x0) {
      free(local_8);
      local_8 = (dynlink)0x0;
    }
  }
  return local_8;
}

Assistant:

dynlink dynlink_load_absolute(dynlink_path path, dynlink_flags flags)
{
	dynlink handle = malloc(sizeof(struct dynlink_type));

	if (handle == NULL)
	{
		return NULL;
	}

	strncpy(handle->name_impl, path, strnlen(path, PORTABILITY_PATH_SIZE) + 1);

	handle->flags = flags;

	handle->impl = dynlink_impl_load(handle);

	if (handle->impl == NULL)
	{
		free(handle);
		return NULL;
	}

	return handle;
}